

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O1

size_t wabt::cat_compute_size<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                 (char (*t) [11],
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                 char (*args_1) [8],
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                 char (*args_3) [2])

{
  size_type sVar1;
  size_type sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar3 = strlen(*t);
  sVar1 = args->_M_string_length;
  sVar4 = strlen(*args_1);
  sVar2 = args_2->_M_string_length;
  sVar5 = strlen(*args_3);
  return sVar5 + sVar4 + sVar3 + sVar1 + sVar2;
}

Assistant:

size_t cat_compute_size(const T& t, const Ts&... args) {
    return string_view(t).size() + cat_compute_size(args...);
}